

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_internal_V2_annotation.cpp
# Opt level: O0

ON_OBSOLETE_V5_DimExtra * AnnotationExtension(ON_OBSOLETE_V5_Annotation *pDim,bool bCreate)

{
  bool bVar1;
  ON_UserData *p;
  ON_OBSOLETE_V5_DimExtra *this;
  ON_UUID local_30;
  ON_OBSOLETE_V5_DimExtra *local_20;
  ON_OBSOLETE_V5_DimExtra *pExtra;
  ON_OBSOLETE_V5_Annotation *pOStack_10;
  bool bCreate_local;
  ON_OBSOLETE_V5_Annotation *pDim_local;
  
  local_20 = (ON_OBSOLETE_V5_DimExtra *)0x0;
  if (pDim != (ON_OBSOLETE_V5_Annotation *)0x0) {
    pExtra._7_1_ = bCreate;
    pOStack_10 = pDim;
    local_30 = ON_ClassId::Uuid(&ON_OBSOLETE_V5_DimExtra::m_ON_OBSOLETE_V5_DimExtra_class_rtti);
    p = ON_Object::GetUserData((ON_Object *)pDim,&local_30);
    local_20 = ON_OBSOLETE_V5_DimExtra::Cast(&p->super_ON_Object);
    if ((local_20 == (ON_OBSOLETE_V5_DimExtra *)0x0) && ((pExtra._7_1_ & 1) != 0)) {
      this = (ON_OBSOLETE_V5_DimExtra *)operator_new(0x118);
      ON_OBSOLETE_V5_DimExtra::ON_OBSOLETE_V5_DimExtra(this);
      local_20 = this;
      if ((this != (ON_OBSOLETE_V5_DimExtra *)0x0) &&
         (bVar1 = ON_Object::AttachUserData((ON_Object *)pOStack_10,(ON_UserData *)this), !bVar1)) {
        if (local_20 != (ON_OBSOLETE_V5_DimExtra *)0x0) {
          (*(local_20->super_ON_UserData).super_ON_Object._vptr_ON_Object[4])();
        }
        local_20 = (ON_OBSOLETE_V5_DimExtra *)0x0;
      }
    }
  }
  return local_20;
}

Assistant:

static ON_OBSOLETE_V5_DimExtra* AnnotationExtension(ON_OBSOLETE_V5_Annotation* pDim, bool bCreate)
{
  ON_OBSOLETE_V5_DimExtra* pExtra = 0;
  if(pDim)
  {
    pExtra = ON_OBSOLETE_V5_DimExtra::Cast(pDim->GetUserData(ON_CLASS_ID(ON_OBSOLETE_V5_DimExtra)));
    if(pExtra == 0 && bCreate)
    {
      pExtra = new ON_OBSOLETE_V5_DimExtra;
      if( pExtra)
      {
        if(!pDim->AttachUserData(pExtra))
        {
          delete pExtra;
          pExtra = 0;
        }
      }
    }
  }
  return pExtra;
}